

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

char * duckdb_re2::re2_internal::TerminateNumber
                 (char *buf,size_t nbuf,char *str,size_t *np,bool accept_spaces)

{
  int iVar1;
  ulong *in_RCX;
  char *in_RDX;
  long in_RSI;
  char *in_RDI;
  byte in_R8B;
  bool bVar2;
  bool bVar3;
  bool neg;
  size_t n;
  ulong local_38;
  char *local_20;
  char *local_8;
  
  local_38 = *in_RCX;
  if (local_38 == 0) {
    local_8 = anon_var_dwarf_3eb64fd + 9;
  }
  else {
    local_20 = in_RDX;
    if ((local_38 != 0) && (iVar1 = isspace((int)*in_RDX), iVar1 != 0)) {
      if ((in_R8B & 1) == 0) {
        local_8 = anon_var_dwarf_3eb64fd + 9;
        return local_8;
      }
      while( true ) {
        bVar2 = false;
        if (local_38 != 0) {
          iVar1 = isspace((int)*local_20);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_38 = local_38 - 1;
        local_20 = local_20 + 1;
      }
    }
    bVar2 = false;
    if ((local_38 != 0) && (*local_20 == '-')) {
      bVar2 = true;
      local_38 = local_38 - 1;
      local_20 = local_20 + 1;
    }
    if (((2 < local_38) && (*local_20 == '0')) && (local_20[1] == '0')) {
      while( true ) {
        bVar3 = false;
        if (2 < local_38) {
          bVar3 = local_20[2] == '0';
        }
        if (!bVar3) break;
        local_38 = local_38 - 1;
        local_20 = local_20 + 1;
      }
    }
    if (bVar2) {
      local_38 = local_38 + 1;
      local_20 = local_20 + -1;
    }
    if (in_RSI - 1U < local_38) {
      local_8 = anon_var_dwarf_3eb64fd + 9;
    }
    else {
      memmove(in_RDI,local_20,local_38);
      if (bVar2) {
        *in_RDI = '-';
      }
      in_RDI[local_38] = '\0';
      *in_RCX = local_38;
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

static const char* TerminateNumber(char* buf, size_t nbuf, const char* str,
                                   size_t* np, bool accept_spaces) {
  size_t n = *np;
  if (n == 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}